

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O1

mkv_timestamp_t MATROSKA_BlockGetFrameEnd(matroska_block *Block,size_t FrameNum)

{
  mkv_timestamp_t mVar1;
  long lVar2;
  long lVar3;
  
  mVar1 = MATROSKA_BlockGetFrameStart(Block,FrameNum);
  lVar3 = 0x7fffffffffffffff;
  if (mVar1 != 0x7fffffffffffffff) {
    lVar2 = 0x7fffffffffffffff;
    if (FrameNum < (Block->Durations)._Used >> 3) {
      lVar2 = *(long *)((Block->Durations)._Begin + FrameNum * 8);
    }
    if (lVar2 != 0x7fffffffffffffff) {
      lVar3 = mVar1 + lVar2;
    }
  }
  return lVar3;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockGetFrameEnd(const matroska_block *Block, size_t FrameNum)
{
    mkv_timestamp_t Result = MATROSKA_BlockGetFrameStart(Block,FrameNum), a;
    if (Result==INVALID_TIMESTAMP_T)
        return INVALID_TIMESTAMP_T;
    a = MATROSKA_BlockGetFrameDuration(Block,FrameNum);
    if (a==INVALID_TIMESTAMP_T)
        return INVALID_TIMESTAMP_T;
    return Result + a;
}